

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_layout_row_push(nk_context *ctx,float ratio_or_width)

{
  nk_panel *pnVar1;
  float local_30;
  float local_2c;
  float local_28;
  float ratio;
  nk_panel *layout;
  nk_window *win;
  float ratio_or_width_local;
  nk_context *ctx_local;
  
  if ((((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
      (ctx->current->layout != (nk_panel *)0x0)) &&
     ((pnVar1 = ctx->current->layout, (pnVar1->row).type == NK_LAYOUT_STATIC_ROW ||
      ((pnVar1->row).type == NK_LAYOUT_DYNAMIC_ROW)))) {
    if ((pnVar1->row).type == NK_LAYOUT_DYNAMIC_ROW) {
      if (ratio_or_width + (pnVar1->row).filled <= 1.0) {
        if (ratio_or_width <= 0.0) {
          (pnVar1->row).item_width = 1.0 - (pnVar1->row).filled;
        }
        else {
          local_28 = ratio_or_width;
          if (1.0 < ratio_or_width) {
            local_28 = 1.0;
          }
          if (local_28 <= 0.0) {
            local_30 = 0.0;
          }
          else {
            local_2c = ratio_or_width;
            if (1.0 < ratio_or_width) {
              local_2c = 1.0;
            }
            local_30 = local_2c;
          }
          (pnVar1->row).item_width = local_30;
        }
      }
    }
    else {
      (pnVar1->row).item_width = ratio_or_width;
    }
  }
  return;
}

Assistant:

NK_API void
nk_layout_row_push(struct nk_context *ctx, float ratio_or_width)
{
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
NK_ASSERT(layout->row.type == NK_LAYOUT_STATIC_ROW || layout->row.type == NK_LAYOUT_DYNAMIC_ROW);
if (layout->row.type != NK_LAYOUT_STATIC_ROW && layout->row.type != NK_LAYOUT_DYNAMIC_ROW)
return;

if (layout->row.type == NK_LAYOUT_DYNAMIC_ROW) {
float ratio = ratio_or_width;
if ((ratio + layout->row.filled) > 1.0f) return;
if (ratio > 0.0f)
layout->row.item_width = NK_SATURATE(ratio);
else layout->row.item_width = 1.0f - layout->row.filled;
} else layout->row.item_width = ratio_or_width;
}